

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboRenderTest.cpp
# Opt level: O2

string * __thiscall
deqp::gles3::Functional::FboConfig::getName_abi_cxx11_
          (string *__return_storage_ptr__,FboConfig *this)

{
  uint uVar1;
  char *pcVar2;
  ostream *poVar3;
  ostringstream name;
  ostream local_190;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  pcVar2 = getTypeName(this->colorType);
  poVar3 = std::operator<<(&local_190,pcVar2);
  poVar3 = std::operator<<(poVar3,"_");
  pcVar2 = FboTestUtil::getFormatName(this->colorFormat);
  std::operator<<(poVar3,pcVar2);
  uVar1 = this->buffers;
  if ((uVar1 >> 8 & 1) != 0) {
    std::operator<<(&local_190,"_depth");
    uVar1 = this->buffers;
  }
  if ((uVar1 >> 10 & 1) != 0) {
    std::operator<<(&local_190,"_stencil");
    uVar1 = this->buffers;
  }
  if ((uVar1 & 0x500) != 0) {
    poVar3 = std::operator<<(&local_190,"_");
    pcVar2 = getTypeName(this->depthStencilType);
    poVar3 = std::operator<<(poVar3,pcVar2);
    poVar3 = std::operator<<(poVar3,"_");
    pcVar2 = FboTestUtil::getFormatName(this->depthStencilFormat);
    std::operator<<(poVar3,pcVar2);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string FboConfig::getName (void) const
{
	std::ostringstream name;

	DE_ASSERT(buffers & GL_COLOR_BUFFER_BIT);
	name << getTypeName(colorType) << "_" << getFormatName(colorFormat);

	if (buffers & GL_DEPTH_BUFFER_BIT)
		name << "_depth";
	if (buffers & GL_STENCIL_BUFFER_BIT)
		name << "_stencil";

	if (buffers & (GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT))
		name << "_" << getTypeName(depthStencilType) << "_" << getFormatName(depthStencilFormat);

	return name.str();
}